

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

bool __thiscall
my_crc_basic::calc_crc
          (my_crc_basic *this,value_type use_initial,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *msg,value_type expected_crc
          ,FEED_TYPE feed_type)

{
  bool bVar1;
  value_type vVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  this->rem_ = use_initial;
  switch(feed_type) {
  case AUTO:
    if (this->rft_in_ != true) goto switchD_00112b9f_caseD_1;
    if ((*(ulong *)(msg + 0x18) & 7) == 0) goto switchD_00112b9f_caseD_3;
    uVar4 = *(ulong *)(msg + 0x18) & 0xffffffff;
    break;
  case LINEAR_FORWARD:
switchD_00112b9f_caseD_1:
    for (uVar4 = 0; uVar4 < *(ulong *)(msg + 0x18); uVar4 = uVar4 + 1) {
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(msg,uVar4);
      process_bit(this,bVar1);
    }
    goto switchD_00112b9f_default;
  case LINEAR_REVERSED:
    uVar4 = (ulong)*(uint *)(msg + 0x18);
    break;
  case BYTEWISE_REVERSED:
switchD_00112b9f_caseD_3:
    uVar4 = 0;
    while (uVar3 = uVar4, uVar3 < *(ulong *)(msg + 0x18)) {
      for (lVar5 = 7; uVar4 = uVar3 + 8, lVar5 != -1; lVar5 = lVar5 + -1) {
        bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (msg,uVar3 + lVar5);
        process_bit(this,bVar1);
      }
    }
  default:
    goto switchD_00112b9f_default;
  }
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) break;
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                      (msg,(ulong)((uint)uVar4 & 0x7fffffff));
    process_bit(this,bVar1);
  }
switchD_00112b9f_default:
  vVar2 = checksum(this);
  return vVar2 == expected_crc;
}

Assistant:

bool my_crc_basic::calc_crc(value_type const use_initial,
			    boost::dynamic_bitset<> const& msg,
			    value_type const expected_crc,
			    FEED_TYPE feed_type) {
  
  reset(use_initial);	


  if(feed_type == AUTO) {
    if(rft_in_) {
      if (msg.size() % 8 != 0) feed_type = LINEAR_REVERSED;
      else feed_type = BYTEWISE_REVERSED;
    }
    else {
      feed_type = LINEAR_FORWARD;
    }
  }


  
  if(feed_type == LINEAR_FORWARD) {
    for (size_t i = 0; i < msg.size(); i++) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == LINEAR_REVERSED) {
    for (int i = msg.size()-1; i >= 0; i--) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == BYTEWISE_REVERSED) {

      for(size_t i = 0; i < msg.size(); i+=8) {
	// inverse feeding
	for(int j = 1; j <= 8; j++)
	  process_bit(msg[i + 8 - j]);
      }
  }
  
  return checksum() == expected_crc;
}